

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O3

int main(void)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  sunindextype Nnew_00;
  uint uVar4;
  UserData udata;
  sunrealtype *psVar5;
  N_Vector y;
  FILE *pFVar6;
  N_Vector ynew;
  long lVar7;
  char *pcVar8;
  long lVar9;
  FILE *__stream;
  double dVar10;
  undefined1 auVar11 [16];
  SUNContext ctx;
  sunrealtype newdt;
  sunrealtype olddt;
  sunrealtype t;
  long nli;
  long nni;
  sunindextype Nnew;
  long local_b8;
  undefined8 local_a8;
  long local_a0;
  ulong local_98;
  FILE *local_90;
  long local_88;
  undefined8 local_80;
  undefined8 local_78;
  double local_70;
  FILE *local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined8 local_48;
  sunindextype local_40;
  long local_38;
  
  uVar4 = SUNContext_Create(0,&local_a8);
  if ((int)uVar4 < 0) {
    pcVar8 = "SUNContext_Create";
  }
  else {
    udata = (UserData)malloc(0x20);
    udata->N = 0x15;
    udata->k = 0.5;
    udata->refine_tol = 0.003;
    psVar5 = (sunrealtype *)malloc(0xa8);
    udata->x = psVar5;
    auVar1 = _DAT_00104030;
    lVar7 = 1;
    auVar11 = _DAT_00104020;
    do {
      if (SUB164(auVar11 ^ auVar1,4) == -0x80000000 && SUB164(auVar11 ^ auVar1,0) < -0x7fffffeb) {
        psVar5[lVar7 + -1] = (double)(lVar7 + -1) / 20.0;
        psVar5[lVar7] = (double)lVar7 / 20.0;
      }
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar9 + 2;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 0x17);
    puts("\n1D adaptive Heat PDE test problem:");
    printf("  diffusion coefficient:  k = %g\n",udata->k);
    printf("  initial N = %li\n",udata->N);
    y = (N_Vector)N_VNew_Serial(0x15,local_a8);
    if (y == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    N_VConst(0,y);
    local_90 = fopen("heat_mesh.txt","w");
    if (0 < udata->N) {
      lVar7 = 0;
      do {
        fprintf(local_90," %.16e",udata->x[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < udata->N);
    }
    fputc(10,local_90);
    pFVar6 = fopen("heat1D.txt","w");
    lVar7 = N_VGetArrayPointer(y);
    if (0 < udata->N) {
      lVar9 = 0;
      do {
        fprintf(pFVar6," %.16e",*(undefined8 *)(lVar7 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 < udata->N);
    }
    fputc(10,pFVar6);
    lVar7 = ARKStepCreate(0,0,f,y,local_a8);
    local_38 = lVar7;
    if (lVar7 == 0) {
      main_cold_5();
      return 1;
    }
    uVar4 = ARKodeSetUserData(lVar7,udata);
    if ((int)uVar4 < 0) {
      pcVar8 = "ARKodeSetUserData";
    }
    else {
      uVar4 = ARKodeSetMaxNumSteps(lVar7,10000);
      if ((int)uVar4 < 0) {
        pcVar8 = "ARKodeSetMaxNumSteps";
      }
      else {
        uVar4 = ARKodeSStolerances(0x3f50624dd2f1a9fc,0x3ddb7cdfd9d7bdbb,lVar7);
        if ((int)uVar4 < 0) {
          pcVar8 = "ARKodeSStolerances";
        }
        else {
          uVar4 = ARKStepSetAdaptivityMethod(lVar7,2,1,0,0);
          if ((int)uVar4 < 0) {
            pcVar8 = "ARKodeSetAdaptivityMethod";
LAB_00102d59:
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar8,(ulong)uVar4);
            return 1;
          }
          uVar4 = ARKodeSetPredictorMethod(lVar7,0);
          if ((int)uVar4 < 0) {
            pcVar8 = "ARKodeSetPredictorMethod";
          }
          else {
            uVar4 = ARKodeSetLinear(lVar7,1);
            if ((int)uVar4 < 0) {
              pcVar8 = "ARKodeSetLinear";
              goto LAB_00102d59;
            }
            lVar9 = SUNLinSol_PCG(y,0,0x15,local_a8);
            if (lVar9 == 0) {
              main_cold_4();
              return 1;
            }
            uVar4 = ARKodeSetLinearSolver(lVar7,lVar9,0);
            if ((int)uVar4 < 0) {
LAB_00102c96:
              pcVar8 = "ARKodeSetLinearSolver";
            }
            else {
              uVar4 = ARKodeSetJacTimes(lVar7,0,Jac);
              if (-1 < (int)uVar4) {
                local_70 = 0.0;
                local_78 = 0;
                local_98 = 0;
                local_80 = 0;
                local_88 = lVar9;
                puts(
                    "  iout          dt_old                 dt_new               ||u||_rms       N   NNI  NLI"
                    );
                puts(
                    " ----------------------------------------------------------------------------------------"
                    );
                uVar3 = local_78;
                uVar2 = local_80;
                dVar10 = (double)N_VDotProd(y,y);
                dVar10 = dVar10 / (double)udata->N;
                if (dVar10 < 0.0) {
                  dVar10 = sqrt(dVar10);
                }
                else {
                  dVar10 = SQRT(dVar10);
                }
                __stream = local_90;
                printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2i  %3i\n",uVar3,uVar2,dVar10,0,
                       udata->N,0,0);
                local_a0 = 0;
                local_b8 = 0;
                local_68 = pFVar6;
                local_50 = lVar7;
                do {
                  pFVar6 = local_68;
                  if (1.0 <= local_70) {
                    puts(
                        " ----------------------------------------------------------------------------------------"
                        );
                    puts(" Final solver statistics:");
                    printf("   Total number of time steps = %i\n",local_98);
                    printf("   Total nonlinear iterations = %li\n",local_a0);
                    printf("   Total linear iterations    = %li\n\n",local_b8);
                    fclose(pFVar6);
                    fclose(__stream);
                    N_VDestroy(y);
                    free(udata->x);
                    free(udata);
                    ARKodeFree(&local_38);
                    SUNLinSolFree(local_88);
                    SUNContext_Free(&local_a8);
                    return 0;
                  }
                  uVar4 = ARKodeSetStopTime(lVar7);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "ARKodeSetStopTime";
                    goto LAB_00102e39;
                  }
                  uVar4 = ARKodeEvolve(0x3ff0000000000000,lVar7,y,&local_70,2);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "ARKodeEvolve";
                    goto LAB_00102e39;
                  }
                  uVar4 = ARKodeGetLastStep(lVar7,&local_78);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "ARKodeGetLastStep";
                    goto LAB_00102e39;
                  }
                  uVar4 = ARKodeGetCurrentStep(lVar7,&local_80);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "ARKodeGetCurrentStep";
                    goto LAB_00102e39;
                  }
                  uVar4 = ARKodeGetNumNonlinSolvIters(lVar7,&local_58);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "ARKodeGetNumNonlinSolvIters";
                    goto LAB_00102e39;
                  }
                  uVar4 = ARKodeGetNumLinIters(lVar7,&local_60);
                  uVar2 = local_78;
                  if ((int)uVar4 < 0) {
                    pcVar8 = "ARKodeGetNumLinIters";
                    goto LAB_00102e39;
                  }
                  local_48 = local_80;
                  dVar10 = (double)N_VDotProd(y,y);
                  dVar10 = dVar10 / (double)udata->N;
                  if (dVar10 < 0.0) {
                    dVar10 = sqrt(dVar10);
                  }
                  else {
                    dVar10 = SQRT(dVar10);
                  }
                  lVar7 = local_a0;
                  local_98 = (ulong)((int)local_98 + 1);
                  printf(" %4i  %19.15e  %19.15e  %19.15e  %li   %2li  %3li\n",uVar2,local_48,dVar10
                         ,local_98,udata->N,local_58,local_60);
                  local_a0 = lVar7 + local_58;
                  local_b8 = local_b8 + local_60;
                  lVar7 = N_VGetArrayPointer(y);
                  pFVar6 = local_68;
                  if (0 < udata->N) {
                    lVar9 = 0;
                    do {
                      fprintf(pFVar6," %.16e",*(undefined8 *)(lVar7 + lVar9 * 8));
                      lVar9 = lVar9 + 1;
                    } while (lVar9 < udata->N);
                  }
                  fputc(10,pFVar6);
                  if (0 < udata->N) {
                    lVar7 = 0;
                    do {
                      fprintf(__stream," %.16e",udata->x[lVar7]);
                      lVar7 = lVar7 + 1;
                    } while (lVar7 < udata->N);
                  }
                  fputc(10,__stream);
                  psVar5 = adapt_mesh(y,&local_40,udata);
                  Nnew_00 = local_40;
                  if (psVar5 == (sunrealtype *)0x0) {
                    main_cold_3();
                    return 1;
                  }
                  ynew = (N_Vector)N_VNew_Serial(local_40,local_a8);
                  if (ynew == (N_Vector)0x0) {
                    main_cold_2();
                    return 1;
                  }
                  project(udata->N,udata->x,y,Nnew_00,psVar5,ynew);
                  N_VDestroy(y);
                  free(udata->x);
                  lVar7 = local_50;
                  udata->x = psVar5;
                  udata->N = Nnew_00;
                  uVar4 = ARKodeResize(0x3ff0000000000000,local_70,local_50,ynew,0,0);
                  if ((int)uVar4 < 0) {
                    pcVar8 = "ARKodeResize";
                    goto LAB_00102e39;
                  }
                  SUNLinSolFree(local_88);
                  lVar9 = SUNLinSol_PCG(ynew,0,0x15,local_a8);
                  if (lVar9 == 0) {
                    main_cold_1();
                    return 1;
                  }
                  uVar4 = ARKodeSetLinearSolver(lVar7,lVar9,0);
                  if ((int)uVar4 < 0) goto LAB_00102c96;
                  local_88 = lVar9;
                  uVar4 = ARKodeSetJacTimes(lVar7,0,Jac);
                  y = ynew;
                  __stream = local_90;
                } while (-1 < (int)uVar4);
              }
              pcVar8 = "ARKodeSetJacTimes";
            }
          }
        }
      }
    }
  }
LAB_00102e39:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar8,(ulong)uVar4);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(1.0);    /* final time */
  sunrealtype rtol   = SUN_RCONST(1.e-3);  /* relative tolerance */
  sunrealtype atol   = SUN_RCONST(1.e-10); /* absolute tolerance */
  sunrealtype hscale = SUN_RCONST(1.0); /* time step change factor on resizes */
  UserData udata     = NULL;
  sunrealtype* data;
  sunindextype N     = 21;                 /* initial spatial mesh size */
  sunrealtype refine = SUN_RCONST(3.0e-3); /* adaptivity refinement tolerance */
  sunrealtype k      = SUN_RCONST(0.5);    /* heat conductivity */
  sunindextype i;
  long int nni, nni_tot = 0, nli, nli_tot = 0;
  int iout = 0;

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  N_Vector y2        = NULL; /* empty vector for storing solution */
  N_Vector yt        = NULL; /* empty vector for swapping */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE *XFID, *UFID;
  sunrealtype t, olddt, newdt;
  sunrealtype* xnew = NULL;
  sunindextype Nnew;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate and fill initial udata structure */
  udata             = (UserData)malloc(sizeof(*udata));
  udata->N          = N;
  udata->k          = k;
  udata->refine_tol = refine;
  udata->x          = malloc(N * sizeof(sunrealtype));
  for (i = 0; i < N; i++) { udata->x[i] = ONE * i / (N - 1); }

  /* Initial problem output */
  printf("\n1D adaptive Heat PDE test problem:\n");
  printf("  diffusion coefficient:  k = %" GSYM "\n", udata->k);
  printf("  initial N = %li\n", (long int)udata->N);

  /* Initialize data structures */
  y = N_VNew_Serial(N, ctx); /* Create initial serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(ZERO, y); /* Set initial conditions */

  /* output mesh to disk */
  XFID = fopen("heat_mesh.txt", "w");

  /* output initial mesh to disk */
  for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
  fprintf(XFID, "\n");

  /* Open output stream for results, access data array */
  UFID = fopen("heat1D.txt", "w");

  /* output initial condition to disk */
  data = N_VGetArrayPointer(y);
  for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
  fprintf(UFID, "\n");

  /* Initialize the ARK timestepper */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)udata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 10000); /* Increase max num steps  */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, rtol, atol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }
  flag = ARKStepSetAdaptivityMethod(arkode_mem, 2, 1, 0,
                                    NULL); /* Set adaptivity method */
  if (check_flag(&flag, "ARKodeSetAdaptivityMethod", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem, 0); /* Set predictor method */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }

  /* Specify linearly implicit RHS, with time-dependent Jacobian */
  flag = ARKodeSetLinear(arkode_mem, 1);
  if (check_flag(&flag, "ARKodeSetLinear", 1)) { return 1; }

  /* Initialize PCG solver -- no preconditioning, with up to N iterations  */
  LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
  if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }

  /* Linear solver interface -- set user-supplied J*v routine (no 'jtsetup' required) */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               NULL); /* Attach linear solver to ARKODE */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  olddt = ZERO;
  newdt = ZERO;
  printf("  iout          dt_old                 dt_new               "
         "||u||_rms       N   NNI  NLI\n");
  printf(" --------------------------------------------------------------------"
         "--------------------\n");
  printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2i  %3i\n",
         iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
         (long int)udata->N, 0, 0);
  while (t < Tf)
  {
    /* "set" routines */
    flag = ARKodeSetStopTime(arkode_mem, Tf);
    if (check_flag(&flag, "ARKodeSetStopTime", 1)) { return 1; }

    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, Tf, y, &t, ARK_ONE_STEP);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

    /* "get" routines */
    flag = ARKodeGetLastStep(arkode_mem, &olddt);
    if (check_flag(&flag, "ARKodeGetLastStep", 1)) { return 1; }
    flag = ARKodeGetCurrentStep(arkode_mem, &newdt);
    if (check_flag(&flag, "ARKodeGetCurrentStep", 1)) { return 1; }
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    if (check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1)) { return 1; }
    flag = ARKodeGetNumLinIters(arkode_mem, &nli);
    if (check_flag(&flag, "ARKodeGetNumLinIters", 1)) { return 1; }

    /* print current solution stats */
    iout++;
    printf(" %4i  %19.15" ESYM "  %19.15" ESYM "  %19.15e  %li   %2li  %3li\n",
           iout, olddt, newdt, sqrt(N_VDotProd(y, y) / udata->N),
           (long int)udata->N, nni, nli);
    nni_tot += nni;
    nli_tot += nli;

    /* output results and current mesh to disk */
    data = N_VGetArrayPointer(y);
    for (i = 0; i < udata->N; i++) { fprintf(UFID, " %.16" ESYM, data[i]); }
    fprintf(UFID, "\n");
    for (i = 0; i < udata->N; i++) { fprintf(XFID, " %.16" ESYM, udata->x[i]); }
    fprintf(XFID, "\n");

    /* adapt the spatial mesh */
    xnew = adapt_mesh(y, &Nnew, udata);
    if (check_flag(xnew, "ark_adapt", 0)) { return 1; }

    /* create N_Vector of new length */
    y2 = N_VNew_Serial(Nnew, ctx);
    if (check_flag((void*)y2, "N_VNew_Serial", 0)) { return 1; }

    /* project solution onto new mesh */
    flag = project(udata->N, udata->x, y, Nnew, xnew, y2);
    if (check_flag(&flag, "project", 1)) { return 1; }

    /* delete old vector, old mesh */
    N_VDestroy(y);
    free(udata->x);

    /* swap x and xnew so that new mesh is stored in udata structure */
    udata->x = xnew;
    xnew     = NULL;
    udata->N = Nnew; /* store size of new mesh */

    /* swap y and y2 so that y holds new solution */
    yt = y;
    y  = y2;
    y2 = yt;

    /* call ARKodeResize to notify integrator of change in mesh */
    flag = ARKodeResize(arkode_mem, y, hscale, t, NULL, NULL);
    if (check_flag(&flag, "ARKodeResize", 1)) { return 1; }

    /* destroy and re-allocate linear solver memory; reattach to ARKODE interface */
    SUNLinSolFree(LS);
    LS = SUNLinSol_PCG(y, 0, (int)N, ctx);
    if (check_flag((void*)LS, "SUNLinSol_PCG", 0)) { return 1; }
    flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL);
    if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
    flag = ARKodeSetJacTimes(arkode_mem, NULL, Jac);
    if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }
  }
  printf(" --------------------------------------------------------------------"
         "--------------------\n");

  /* print some final statistics */
  printf(" Final solver statistics:\n");
  printf("   Total number of time steps = %i\n", iout);
  printf("   Total nonlinear iterations = %li\n", nni_tot);
  printf("   Total linear iterations    = %li\n\n", nli_tot);

  /* Clean up and return with successful completion */
  fclose(UFID);
  fclose(XFID);
  N_VDestroy(y);  /* Free vectors */
  free(udata->x); /* Free user data */
  free(udata);
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}